

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

JSON * chaiscript::json::JSONParser::parse_null
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  substr(&local_b0,str,*offset,4);
  iVar1 = Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_b0,"null");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    *offset = *offset + 4;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->internal).d.
             super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
             .
             super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
     + 0x10) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->internal).d.
             super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
             .
             super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
     + 0x18) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->internal).d.
      super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      .
      super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->internal).d.
             super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
             .
             super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
     + 8) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->internal).d.
             super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
             .
             super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
     + 0x20) = 0;
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"JSON ERROR: Null: Expected \'null\', found \'","");
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  substr(&local_70,str,*offset,4);
  std::operator+(&local_50,&local_90,&local_70);
  pbVar2 = Catch::clara::std::__cxx11::
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(&local_50,"\'")
  ;
  local_b0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar3) {
    local_b0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(this,(string *)&local_b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static JSON parse_null(const std::string &str, size_t &offset) {
      if (str.substr(offset, 4) != "null") {
        throw std::runtime_error(std::string("JSON ERROR: Null: Expected 'null', found '") + str.substr(offset, 4) + "'");
      }
      offset += 4;
      return JSON();
    }